

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O3

TouchPoint * __thiscall
QTuioHandler::cursorToTouchPoint
          (TouchPoint *__return_storage_ptr__,QTuioHandler *this,QTuioCursor *tc,QWindow *win)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  int extraout_var;
  undefined8 uVar7;
  int extraout_var_00;
  long lVar8;
  undefined8 *puVar9;
  TouchPoint *pTVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  QPointF QVar15;
  float fStack_3c;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  puVar9 = &DAT_00110530;
  pTVar10 = __return_storage_ptr__;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pTVar10 = *puVar9;
    puVar9 = puVar9 + 1;
    pTVar10 = (TouchPoint *)&pTVar10->uniqueId;
  }
  __return_storage_ptr__->uniqueId = -1;
  (__return_storage_ptr__->area).xp = 0.0;
  (__return_storage_ptr__->area).yp = 0.0;
  (__return_storage_ptr__->area).w = 0.0;
  (__return_storage_ptr__->area).h = 0.0;
  __return_storage_ptr__->pressure = 0.0;
  __return_storage_ptr__->rotation = 0.0;
  __return_storage_ptr__->state = Stationary;
  *(undefined8 *)(__return_storage_ptr__->velocity).v = 0;
  (__return_storage_ptr__->rawPositions).d.d = (Data *)0x0;
  (__return_storage_ptr__->rawPositions).d.ptr = (QPointF *)0x0;
  (__return_storage_ptr__->rawPositions).d.size = 0;
  __return_storage_ptr__->id = tc->m_id;
  __return_storage_ptr__->pressure = 1.0;
  uVar1 = tc->m_x;
  uVar2 = tc->m_y;
  (__return_storage_ptr__->normalPosition).xp = (double)(float)uVar1;
  (__return_storage_ptr__->normalPosition).yp = (double)(float)uVar2;
  if ((*(ushort *)(this + 0xb0) & 0x3e0) == 0) {
    uVar5 = *(ushort *)(this + 0xb0) & 0x1f;
  }
  else {
    uVar5 = QTransform::type();
  }
  if (uVar5 != 0) {
    QVar15 = (QPointF)QTransform::map((QPointF *)(this + 0x68));
    __return_storage_ptr__->normalPosition = QVar15;
  }
  __return_storage_ptr__->state = tc->m_state;
  iVar6 = (**(code **)(*(long *)win + 0x70))(win);
  dVar13 = (__return_storage_ptr__->normalPosition).xp;
  (**(code **)(*(long *)win + 0x70))(win);
  dVar13 = dVar13 * (double)iVar6;
  dVar14 = (__return_storage_ptr__->normalPosition).yp * (double)extraout_var;
  auVar11._0_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
  auVar11._8_8_ = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
  auVar12 = maxpd(auVar11,_DAT_001101c0);
  uVar7 = QWindow::mapToGlobal((QPoint *)win);
  (__return_storage_ptr__->area).xp =
       ((double)(int)uVar7 +
       (dVar13 - (double)(int)(double)(~-(ulong)(2147483647.0 < auVar11._0_8_) & auVar12._0_8_ |
                                      -(ulong)(2147483647.0 < auVar11._0_8_) & 0x41dfffffffc00000)))
       - (__return_storage_ptr__->area).w * 0.5;
  (__return_storage_ptr__->area).yp =
       ((double)(int)((ulong)uVar7 >> 0x20) +
       (dVar14 - (double)(int)(double)(~-(ulong)(2147483647.0 < auVar11._8_8_) & auVar12._8_8_ |
                                      -(ulong)(2147483647.0 < auVar11._8_8_) & 0x41dfffffffc00000)))
       - (__return_storage_ptr__->area).h * 0.5;
  iVar6 = (**(code **)(*(long *)win + 0x70))(win);
  uVar4 = tc->m_vx;
  (**(code **)(*(long *)win + 0x70))(win);
  *(ulong *)(__return_storage_ptr__->velocity).v =
       CONCAT44(tc->m_vy * (float)extraout_var_00,(float)uVar4 * (float)iVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QWindowSystemInterface::TouchPoint QTuioHandler::cursorToTouchPoint(const QTuioCursor &tc, QWindow *win)
{
    QWindowSystemInterface::TouchPoint tp;
    tp.id = tc.id();
    tp.pressure = 1.0f;

    tp.normalPosition = QPointF(tc.x(), tc.y());

    if (!m_transform.isIdentity())
        tp.normalPosition = m_transform.map(tp.normalPosition);

    tp.state = tc.state();

    // we map the touch to the size of the window. we do this, because frankly,
    // trying to figure out which part of the screen to hit in order to press an
    // element on the UI is pretty tricky when one is not using an overlay-style
    // TUIO device.
    //
    // in the future, it might make sense to make this choice optional,
    // dependent on the spec.
    QPointF relPos = QPointF(win->size().width() * tp.normalPosition.x(), win->size().height() * tp.normalPosition.y());
    QPointF delta = relPos - relPos.toPoint();
    tp.area.moveCenter(win->mapToGlobal(relPos.toPoint()) + delta);
    tp.velocity = QVector2D(win->size().width() * tc.vx(), win->size().height() * tc.vy());
    return tp;
}